

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O2

bool __thiscall
TPZHCurlEquationFilter<std::complex<double>_>::FilterEdgeEquations
          (TPZHCurlEquationFilter<std::complex<double>_> *this,TPZCompMesh *cmesh,
          TPZVec<long> *activeEquations,bool domainHybridization)

{
  TPZAdmChunkVector<TPZCompEl_*,_10> *pTVar1;
  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
  *pmVar2;
  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
  *this_00;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar3;
  uint uVar4;
  TPZGeoMesh *gmesh;
  TPZCompEl *this_01;
  TNode *pTVar5;
  long *plVar6;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar7;
  int64_t iVar8;
  TPZHCurlEquationFilter<std::complex<double>_> *pTVar9;
  int iVar10;
  bool *walk;
  mapped_type *pmVar11;
  reference ppTVar12;
  TPZGeoEl *pTVar13;
  iterator iVar14;
  TPZConnect *pTVar15;
  ulong uVar16;
  ostream *poVar17;
  mapped_type *pmVar18;
  _Rb_tree_node_base *p_Var19;
  undefined7 in_register_00000009;
  bool *pbVar20;
  int iCon;
  vectype *pvVar21;
  size_t i;
  long lVar22;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar23;
  int64_t remEdge;
  TPZHCurlEquationFilter<std::complex<double>_> *local_b8;
  int local_ac;
  vectype *local_a8;
  vectype *local_a0;
  TPZCompMesh *local_98;
  TPZVec<long> *local_90;
  iterator __begin2;
  _Rb_tree_node_base *local_70;
  TPZVec<bool> done_vertices;
  
  local_90 = activeEquations;
  TPZCompMesh::LoadReferences(cmesh);
  gmesh = cmesh->fReference;
  local_a0 = (vectype *)(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  __begin2.chunkVector = (vectype *)((ulong)__begin2.chunkVector & 0xffffffffffffff00);
  local_98 = cmesh;
  TPZVec<bool>::TPZVec(&done_vertices,(int64_t)local_a0,(bool *)&__begin2);
  local_ac = (int)CONCAT71(in_register_00000009,domainHybridization);
  local_b8 = this;
  if (local_ac == 0) {
    InitDataStructures(this,gmesh);
    FirstEdge(this);
    pmVar2 = &this->mVertex;
    this_00 = &this->mEdge;
    for (lVar22 = 2; lVar22 < (long)local_a0; lVar22 = lVar22 + 1) {
      ChooseVertexAndEdge(this,(int64_t *)&__begin2,&remEdge);
      iVar8 = remEdge;
      pmVar18 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                ::operator[](pmVar2,(key_type_conflict1 *)&__begin2);
      pmVar18->removed_edge = iVar8;
      pmVar18 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                ::operator[](pmVar2,(key_type_conflict1 *)&__begin2);
      pvVar21 = __begin2.chunkVector;
      pmVar18->status = ETreatedVertex;
      pmVar11 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                ::operator[](this_00,&remEdge);
      pmVar11->vertex_treated = (int64_t)pvVar21;
      CheckFaces(local_b8);
      this = local_b8;
    }
    for (pvVar21 = (vectype *)0x0; local_a0 != pvVar21;
        pvVar21 = (vectype *)((long)&(pvVar21->super_TPZSavable)._vptr_TPZSavable + 1)) {
      __begin2.chunkVector = pvVar21;
      pmVar18 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                ::operator[](pmVar2,(key_type_conflict1 *)&__begin2);
      if (pmVar18->status == ETreatedVertex) {
        done_vertices.fStore[(long)pvVar21] = true;
        __begin2.chunkVector = pvVar21;
        pmVar18 = std::
                  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                  ::operator[](pmVar2,(key_type_conflict1 *)&__begin2);
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &this->removed_edges,&pmVar18->removed_edge);
      }
    }
  }
  else {
    pbVar20 = done_vertices.fStore + done_vertices.fNElements;
    for (; done_vertices.fStore < pbVar20; done_vertices.fStore = done_vertices.fStore + 1) {
      *done_vertices.fStore = true;
    }
    pTVar1 = &local_98->fElementVec;
    __begin2.cur_index = 0;
    lVar22 = (local_98->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
    psVar3 = &this->removed_edges;
    __begin2.chunkVector = &pTVar1->super_TPZChunkVector<TPZCompEl_*,_10>;
    for (; ((TPZAdmChunkVector<TPZCompEl_*,_10> *)__begin2.chunkVector != pTVar1 ||
           (__begin2.cur_index != lVar22)); __begin2.cur_index = __begin2.cur_index + 1) {
      ppTVar12 = TPZChunkVectorIterator<false,_TPZCompEl_*,_10>::operator*(&__begin2);
      this_01 = *ppTVar12;
      if (this_01 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)this_01 + 0x68))(this_01);
        pTVar13 = TPZCompEl::Reference(this_01);
        if (pTVar13 != (TPZGeoEl *)0x0) {
          (**(code **)(*(long *)pTVar13 + 0x210))(pTVar13);
          iVar10 = (**(code **)(*(long *)pTVar13 + 0x210))(pTVar13);
          if (iVar10 == 3) {
            iVar10 = (**(code **)(*(long *)pTVar13 + 0xb8))(pTVar13);
            if (iVar10 == 7) {
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,0);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,1,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,3,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,6,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,7,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,8,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,0xb,pVar23._8_8_);
              std::
              _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
              _M_insert_unique<long>(&psVar3->_M_t,&remEdge);
            }
            else {
              if (iVar10 != 4) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZHCurlEquationFilter.cpp"
                           ,0x144);
              }
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,0);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,1,pVar23._8_8_);
              pVar23 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&psVar3->_M_t,&remEdge);
              remEdge = (**(code **)(*(long *)this_01 + 0xa0))(this_01,5,pVar23._8_8_);
              std::
              _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
              _M_insert_unique<long>(&psVar3->_M_t,&remEdge);
            }
          }
        }
      }
    }
  }
  pTVar9 = local_b8;
  if ((char)local_ac == '\0') {
    pmVar2 = &local_b8->mVertex;
    pvVar21 = (vectype *)0x0;
    local_a8 = (vectype *)0x0;
    if (0 < (long)local_a0) {
      local_a8 = local_a0;
    }
    while (local_a8 != pvVar21) {
      __begin2.chunkVector = pvVar21;
      pmVar18 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                ::operator[](pmVar2,(key_type_conflict1 *)&__begin2);
      pvVar21 = (vectype *)((long)&(pvVar21->super_TPZSavable)._vptr_TPZSavable + 1);
      if (pmVar18->status != ETreatedVertex) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZHCurlEquationFilter.cpp"
                   ,0x18b);
      }
    }
    for (pvVar21 = (vectype *)0x0; pvVar21 != local_a8;
        pvVar21 = (vectype *)((long)&(pvVar21->super_TPZSavable)._vptr_TPZSavable + 1)) {
      remEdge = (int64_t)pvVar21;
      pmVar18 = std::
                map<long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::VertexFilter>_>_>
                ::operator[](pmVar2,&remEdge);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &__begin2,
                 (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 pmVar18);
      for (p_Var19 = local_70; p_Var19 != (_Rb_tree_node_base *)&__begin2.cur_index;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        remEdge = (int64_t)(int)p_Var19[1]._M_color;
        iVar14 = std::
                 _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                 ::find(&(pTVar9->removed_edges)._M_t,&remEdge);
        if ((_Rb_tree_header *)iVar14._M_node ==
            &(pTVar9->removed_edges)._M_t._M_impl.super__Rb_tree_header) break;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &__begin2);
    }
  }
  (*local_90->_vptr_TPZVec[3])(local_90,0);
  psVar3 = &local_b8->removed_edges;
  psVar7 = &local_b8->removed_edges;
  local_a8 = (vectype *)&local_98->fConnectVec;
  for (pvVar21 = (vectype *)0x0;
      (long)pvVar21 < (local_98->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
      pvVar21 = (vectype *)((long)&(pvVar21->super_TPZSavable)._vptr_TPZSavable + 1)) {
    __begin2.chunkVector = pvVar21;
    iVar14 = std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
             ::find(&psVar3->_M_t,(key_type_conflict1 *)&__begin2);
    if ((_Rb_tree_header *)iVar14._M_node == &(psVar7->_M_t)._M_impl.super__Rb_tree_header) {
      pTVar15 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)local_a8,(int64_t)pvVar21);
      if (((pTVar15->fDependList == (TPZDepend *)0x0) && (-1 < pTVar15->fSequenceNumber)) &&
         ((pTVar15->field_2).fCompose.fIsCondensed == false)) {
        iVar10 = (int)pTVar15->fSequenceNumber;
        pTVar5 = (local_98->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        uVar4 = pTVar5[iVar10].dim;
        if ((long)(int)uVar4 != 0) {
          iVar10 = pTVar5[iVar10].pos;
          lVar22 = local_90->fNElements;
          (*local_90->_vptr_TPZVec[3])(local_90,(int)uVar4 + lVar22);
          plVar6 = local_90->fStore;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
            plVar6[lVar22 + uVar16] = uVar16 + (long)iVar10;
          }
        }
      }
    }
  }
  if (((char)local_ac == '\0') &&
     ((undefined1 *)(local_b8->removed_edges)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (undefined1 *)((long)local_a0[-1].fVec.fExtAlloc + 0x4fU))) {
    poVar17 = std::operator<<((ostream *)&std::cout,"Removed ");
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    poVar17 = std::operator<<(poVar17,"/");
    poVar17 = std::ostream::_M_insert<long>((long)poVar17);
    poVar17 = std::operator<<(poVar17," allowed connects.");
    std::endl<char,std::char_traits<char>>(poVar17);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZHCurlEquationFilter.cpp"
               ,0x1bb);
  }
  TPZVec<bool>::~TPZVec(&done_vertices);
  return false;
}

Assistant:

bool TPZHCurlEquationFilter<TVar>::FilterEdgeEquations(TPZCompMesh* cmesh,
                    TPZVec<int64_t> &activeEquations, bool domainHybridization)
{

    cmesh->LoadReferences();
    const auto gmesh = cmesh->Reference();  
    auto nnodes = gmesh->NNodes();

    TPZVec<bool> done_vertices(nnodes, false);

    if (domainHybridization)
    {
        done_vertices = true;
        for (auto cel : cmesh->ElementVec())
        {   
            if (!cel) continue;
            cel->LoadElementReference();
            auto gel = cel->Reference();
            if (!gel) continue;
            int dimg = gel->Dimension();
            if (gel->Dimension() != 3) continue;

            switch (gel->Type())
            {
            case ETetraedro:
                removed_edges.insert(cel->ConnectIndex(0));
                removed_edges.insert(cel->ConnectIndex(1));
                removed_edges.insert(cel->ConnectIndex(5));
                break;
            case ECube:
                removed_edges.insert(cel->ConnectIndex(0));
                removed_edges.insert(cel->ConnectIndex(1));
                removed_edges.insert(cel->ConnectIndex(3));
                removed_edges.insert(cel->ConnectIndex(6));
                removed_edges.insert(cel->ConnectIndex(7));
                removed_edges.insert(cel->ConnectIndex(8));
                removed_edges.insert(cel->ConnectIndex(11));
                break;
            
            default:
                DebugStop();
                break;
            }
        }      
   
    } else {
        //Initialize the data structures
        InitDataStructures(gmesh);

        // Choose the first edge to be removed
        FirstEdge();

        // Always starts with 1 nodes treated + 1 node which edge will not be removed
        int64_t treated_nodes = 2;

        // While there is a node to be treated
        while (treated_nodes < nnodes)
        {
            // - Escolher um nó do mapa
            int64_t treatVertex, remEdge;
            ChooseVertexAndEdge(treatVertex,remEdge);

            mVertex[treatVertex].removed_edge = remEdge;
            mVertex[treatVertex].status = ETreatedVertex;
            mEdge[remEdge].vertex_treated = treatVertex;

            // Updates the edges (if some needs to be blocked) and faces status.
            // UpdateEdgeAndFaceStatus(remEdge);
            
            // Checks if all edges of a face have been removed
            CheckFaces();

            treated_nodes++;
            
        }//while

        for (size_t i = 0; i < nnodes; i++)//skip the first node since it is not associated to a removed edge
        {
            if (mVertex[i].status == ETreatedVertex) {
                done_vertices[i] = true;
                removed_edges.insert(mVertex[i].removed_edge);
            }
        }
    }
    
    // std::cout << "Removed (" << removed_edges.size() << ") = ";
    // for (auto rem : removed_edges)
    // {
    //     std::cout << rem << " " ;
    // }
    // std::cout << std::endl;

    // for (int i = 0; i < nnodes; i++)
    // {
    //     std::cout << "MVertex (" << i << ") = " << mVertex[i].removed_edge << std::endl;
    // }
    
    



    if (!domainHybridization){
        bool check_all_vertices{true};
        for(auto iv = 0; iv < nnodes; iv++){
            bool v = true;
            if (mVertex[iv].status != ETreatedVertex) v = false;
            check_all_vertices = check_all_vertices && v;
            if(!v){
            break;
            }
        }
        if (!check_all_vertices) DebugStop();
     
        bool check_edges_left{true};
        for(auto iv = 0; iv < nnodes; iv++){
            const auto all_edges = mVertex[iv].edge_connect;
            bool local_check{false};
            for(auto edge: all_edges){
                if(removed_edges.find(edge) == removed_edges.end()){
                    local_check = true;
                    break;
                }
            }
            check_edges_left = local_check && check_edges_left;
        }

        // if (!check_edges_left) DebugStop();
    }


    activeEquations.Resize(0);
    for (int iCon = 0; iCon < cmesh->NConnects(); iCon++) {
        if (removed_edges.find(iCon) == removed_edges.end()) {
            auto &con = cmesh->ConnectVec()[iCon];
            if (con.HasDependency()){
                continue;
            }
            const auto seqnum = con.SequenceNumber();
            if (seqnum<0) continue;
            if (con.IsCondensed()) continue;


            const auto pos = cmesh->Block().Position(seqnum);
            const auto blocksize = cmesh->Block().Size(seqnum);
            if (blocksize == 0){
                continue;
            }
            
            const auto vs = activeEquations.size();
            activeEquations.Resize(vs + blocksize);
            for (auto ieq = 0; ieq < blocksize; ieq++) {
                activeEquations[vs + ieq] = pos + ieq;
            }
        }
    }
    
    if (!domainHybridization){
        if (removed_edges.size() != nnodes-1){
            std::cout << "Removed " << removed_edges.size() << "/" << nnodes-1 << " allowed connects."  << std::endl;
            DebugStop();
        }
    } 

    return 0;
}